

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>::
emplaceRealloc<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>
          (SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
           *this,pointer pos,
          variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pvVar4;
  long lVar5;
  pointer pvVar6;
  pointer pvVar7;
  EVP_PKEY_CTX *ctx;
  undefined8 *in_RDX;
  iterator in_RSI;
  SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
  *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
          ::max_size((SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
                      *)0x81ba9b);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
          ::calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pvVar4 = SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
           ::begin(in_RDI);
  lVar5 = (long)__last - (long)pvVar4;
  pvVar6 = (pointer)operator_new(0x81bafa);
  pvVar7 = pvVar6 + (lVar5 >> 4);
  (pvVar7->super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
  super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
  super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
  super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
  super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
  super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>._M_u =
       (_Variadic_union<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>)*in_RDX;
  *(undefined8 *)
   &(pvVar7->super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
    super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
    super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
    super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
    super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
    super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
    _M_index = in_RDX[1];
  pvVar4 = SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
           ::end(in_RDI);
  if (in_RSI == pvVar4) {
    pvVar4 = SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
             ::begin(in_RDI);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
          ::end(in_RDI);
    std::
    uninitialized_move<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>*,std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>*>
              (in_RSI,__last,pvVar4);
  }
  else {
    SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>::
    begin(in_RDI);
    std::
    uninitialized_move<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>*,std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
          ::end(in_RDI);
    std::
    uninitialized_move<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>*,std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>::
  cleanup(in_RDI,ctx);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pvVar6;
  return pvVar7;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}